

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O2

bool read_jpeg_image(QImage *outImage,QSize scaledSize,QRect scaledClipRect,QRect clipRect,
                    int quality,Rgb888ToRgb32Converter converter,j_decompress_ptr info,
                    my_error_mgr *err,bool invertCMYK)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  JSAMPROW pJVar4;
  QRect QVar5;
  QRect QVar6;
  QRect QVar7;
  undefined1 auVar8 [16];
  Representation RVar9;
  Representation RVar10;
  char cVar11;
  byte bVar12;
  int iVar13;
  Representation RVar14;
  uint uVar15;
  uint uVar16;
  JSAMPARRAY ppJVar17;
  long lVar18;
  quint32 *pqVar19;
  void *pvVar20;
  Representation RVar21;
  uint uVar22;
  Format FVar23;
  uint uVar24;
  ulong uVar25;
  Representation RVar26;
  AspectRatioMode AVar27;
  uint uVar28;
  QSize QVar29;
  Representation RVar30;
  long in_FS_OFFSET;
  double dVar31;
  undefined1 auVar32 [16];
  Representation RVar33;
  Representation RVar34;
  double dVar35;
  QRect QVar36;
  QRect QVar37;
  uchar *row;
  QRect local_88;
  QRect local_78;
  QRect local_68;
  QRect local_50;
  QSize scaledSize_local;
  
  local_68._8_8_ = clipRect._8_8_;
  local_68._0_8_ = clipRect._0_8_;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.x1 = scaledClipRect.x1.m_i;
  RVar34.m_i = local_50.x1.m_i;
  local_50.y1 = scaledClipRect.y1.m_i;
  RVar33.m_i = local_50.y1.m_i;
  local_50.x2 = scaledClipRect.x2.m_i;
  RVar9.m_i = local_50.x2.m_i;
  local_50.y2 = scaledClipRect.y2.m_i;
  RVar10.m_i = local_50.y2.m_i;
  scaledSize_local = scaledSize;
  iVar13 = _setjmp((__jmp_buf_tag *)err->setjmp_buffer);
  QVar36.x2.m_i = local_68.x2.m_i;
  QVar36.y2.m_i = local_68.y2.m_i;
  QVar36.x1.m_i = local_68.x1.m_i;
  QVar36.y1.m_i = local_68.y1.m_i;
  QVar7.x2.m_i = local_68.x2.m_i;
  QVar7.y2.m_i = local_68.y2.m_i;
  QVar7.x1.m_i = local_68.x1.m_i;
  QVar7.y1.m_i = local_68.y1.m_i;
  QVar6.x2.m_i = local_68.x2.m_i;
  QVar6.y2.m_i = local_68.y2.m_i;
  QVar6.x1.m_i = local_68.x1.m_i;
  QVar6.y1.m_i = local_68.y1.m_i;
  QVar5.x2.m_i = local_68.x2.m_i;
  QVar5.y2.m_i = local_68.y2.m_i;
  QVar5.x1.m_i = local_68.x1.m_i;
  QVar5.y1.m_i = local_68.y1.m_i;
  if (iVar13 == 0) {
    uVar25 = (ulong)scaledSize >> 0x20;
    RVar26 = scaledSize.ht.m_i;
    uVar16 = 0x4b;
    if (-1 < quality) {
      uVar16 = quality;
    }
    if (RVar33.m_i <= RVar10.m_i && RVar34.m_i <= RVar9.m_i) {
      RVar21 = clipRect.x1.m_i;
      RVar14 = clipRect.y1.m_i;
      if (RVar26.m_i < 1 || scaledSize.wd.m_i < 1) {
        if (clipRect.y2.m_i.m_i < RVar14.m_i || clipRect.x2.m_i.m_i < RVar21.m_i) {
          QVar36.y1.m_i = local_50.y1.m_i;
          QVar36.x1.m_i = local_50.x1.m_i;
          QVar36.y2.m_i = local_50.y2.m_i;
          QVar36.x2.m_i = local_50.x2.m_i;
        }
        else {
          local_50.x1.m_i = RVar34.m_i + RVar21.m_i;
          local_50.y1.m_i = RVar33.m_i + RVar14.m_i;
          local_50.x2.m_i = RVar9.m_i + RVar21.m_i;
          local_50.y2.m_i = RVar10.m_i + RVar14.m_i;
          QVar36 = (QRect)QRect::operator&(&local_50,&local_68);
        }
      }
      else {
        QVar36 = QVar7;
        if (((RVar14.m_i <= clipRect.y2.m_i.m_i && RVar21.m_i <= clipRect.x2.m_i.m_i) ||
            (uVar15 = info->image_width, QVar36 = QVar5,
            (int)((ulong)uVar15 % ((ulong)scaledSize & 0xffffffff)) != 0)) ||
           (uVar22 = info->image_height, QVar36 = QVar6, (int)((ulong)uVar22 % uVar25) != 0))
        goto LAB_001063c8;
        local_68.x1.m_i = (int)((ulong)(uVar15 * RVar34.m_i) / ((ulong)scaledSize & 0xffffffff));
        QVar36.x2.m_i =
             (int)((ulong)(uVar15 * (RVar9.m_i + 1)) / ((ulong)scaledSize & 0xffffffff)) + -1;
        QVar36.y2.m_i = (int)((uVar22 * (RVar10.m_i + 1)) / uVar25) + -1;
        QVar36.x1.m_i = local_68.x1.m_i;
        QVar36.y1.m_i = (int)((uVar22 * RVar33.m_i) / uVar25);
        RVar30.m_i = (RVar9.m_i + 1) - RVar34.m_i;
        RVar26.m_i = (RVar10.m_i + 1) - RVar33.m_i;
        scaledSize_local.ht.m_i = RVar26.m_i;
        scaledSize_local.wd.m_i = RVar30.m_i;
        scaledSize.ht.m_i = 0;
        scaledSize.wd.m_i = RVar30.m_i;
      }
      local_50.x1.m_i = 0;
      local_50.y1.m_i = 0;
      local_50.x2.m_i = -1;
      local_50.y2.m_i = -1;
    }
LAB_001063c8:
    RVar30 = scaledSize.wd.m_i;
    if (((0 < RVar30.m_i) && (0 < RVar26.m_i)) &&
       ((info->image_width != 0 && (info->image_height != 0)))) {
      local_68.x1 = QVar36.x1.m_i;
      local_68.y1 = QVar36.y1.m_i;
      local_68.x2 = QVar36.x2.m_i;
      local_68.y2 = QVar36.y2.m_i;
      if (local_68.y2.m_i < local_68.y1.m_i || local_68.x2.m_i < local_68.x1.m_i) {
        dVar31 = (double)info->image_width / (double)RVar30.m_i;
        dVar35 = (double)info->image_height / (double)RVar26.m_i;
        if (dVar35 <= dVar31) {
          dVar31 = dVar35;
        }
        local_68 = QVar36;
        dVar31 = ceil(8.0 / dVar31);
        uVar15 = (int)dVar31;
        if (7 < (int)dVar31) {
          uVar15 = 8;
        }
        uVar22 = 1;
        if (1 < (int)uVar15) {
          uVar22 = uVar15;
        }
        info->scale_num = uVar22;
        info->scale_denom = 8;
        QVar36 = local_68;
      }
      else {
        uVar22 = (local_68.x2.m_i - local_68.x1.m_i) + 1;
        uVar28 = (int)uVar22 / RVar30.m_i;
        uVar24 = (local_68.y2.m_i - local_68.y1.m_i) + 1;
        uVar15 = (int)uVar24 / RVar26.m_i;
        if ((int)uVar28 < (int)uVar15) {
          uVar15 = uVar28;
        }
        if (uVar15 < 2) {
          uVar15 = 1;
        }
        else if (uVar15 < 4) {
          uVar15 = 2;
        }
        else {
          uVar15 = (uint)(7 < uVar15) * 4 + 4;
        }
        info->scale_denom = uVar15;
        info->scale_num = 1;
        while ((1 < uVar15 &&
               (((uVar28 = uVar15 - 1, (local_68.x1.m_i & uVar28) != 0 ||
                 ((local_68.y1.m_i & uVar28) != 0)) ||
                (((uVar22 & uVar28) != 0 || ((uVar24 & uVar28) != 0))))))) {
          uVar15 = uVar15 >> 1;
          info->scale_denom = uVar15;
        }
      }
    }
    if (uVar16 < 0x32) {
      info->dct_method = JDCT_IFAST;
      info->do_fancy_upsampling = 0;
    }
    local_68 = QVar36;
    jpeg_calc_output_dimensions(info);
    local_78.x1.m_i = 0;
    local_78.y1.m_i = 0;
    uVar1 = info->output_width;
    uVar2 = info->output_height;
    RVar33.m_i = uVar1 + -1;
    RVar34.m_i = uVar2 + -1;
    local_78._8_8_ = CONCAT44(RVar34.m_i,RVar33.m_i);
    local_88.x1.m_i = -0x55555556;
    local_88.y1.m_i = -0x55555556;
    local_88.x2.m_i = -0x55555556;
    local_88.y2.m_i = -0x55555556;
    if (local_68.y2.m_i < local_68.y1.m_i || local_68.x2.m_i < local_68.x1.m_i) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_78._8_8_;
      QVar37 = (QRect)(auVar8 << 0x40);
      local_88.x1.m_i = 0;
      local_88.y1.m_i = 0;
    }
    else {
      uVar16 = info->scale_denom;
      if (uVar16 == info->scale_num) {
        QVar37 = (QRect)QRect::operator&(&local_68,&local_78);
      }
      else {
        local_88.y1.m_i = local_68.y1.m_i / (int)uVar16;
        local_88.x1.m_i = local_68.x1.m_i / (int)uVar16;
        local_88.y2.m_i =
             local_68.y1.m_i / (int)uVar16 + -1 +
             ((local_68.y2.m_i - local_68.y1.m_i) + 1) / (int)uVar16;
        local_88.x2.m_i =
             local_68.x1.m_i / (int)uVar16 + -1 +
             ((local_68.x2.m_i - local_68.x1.m_i) + 1) / (int)uVar16;
        QVar37 = (QRect)QRect::operator&(&local_88,&local_78);
      }
      RVar33 = QVar37.x2.m_i;
      RVar34 = QVar37.y2.m_i;
      local_88.y1 = QVar37.y1.m_i;
      local_88.x1 = QVar37.x1.m_i;
    }
    iVar13 = info->output_components;
    if (iVar13 == 1) {
      FVar23 = Format_Grayscale8;
    }
    else if (iVar13 == 4) {
      FVar23 = (uint)(info->out_color_space == JCS_CMYK) << 5 | Format_RGB32;
    }
    else {
      if (iVar13 != 3) goto LAB_001061cf;
      FVar23 = Format_RGB32;
    }
    QVar29.wd.m_i = (RVar33.m_i - local_88.x1.m_i) + 1;
    QVar29.ht.m_i = (RVar34.m_i - local_88.y1.m_i) + 1;
    local_88 = QVar37;
    cVar11 = QImageIOHandler::allocateImage(QVar29,FVar23,(QImage *)outImage);
    QVar37 = local_88;
    if (cVar11 != '\0') {
      AVar27 = (AspectRatioMode)outImage;
      if (info->output_components == 1) {
        if (local_88.x1.m_i != local_78.x1.m_i) goto LAB_0010665e;
        if (local_88.x2.m_i != local_78.x2.m_i) goto LAB_0010665e;
        if (local_88.y1.m_i != local_78.y1.m_i) goto LAB_0010665e;
        if (local_88.y2.m_i != local_78.y2.m_i) goto LAB_0010665e;
        jpeg_start_decompress(info);
        while( true ) {
          uVar16 = info->output_height;
          uVar15 = info->output_scanline;
          if (uVar16 <= uVar15) break;
          row = (uchar *)QImage::scanLine(AVar27);
          jpeg_read_scanlines(info,&row,1);
        }
      }
      else {
LAB_0010665e:
        ppJVar17 = (*info->mem->alloc_sarray)
                             ((j_common_ptr)info,1,info->output_components * info->output_width,1);
        jpeg_start_decompress(info);
        while( true ) {
          uVar16 = info->output_height;
          uVar15 = info->output_scanline;
          if (uVar16 <= uVar15) break;
          iVar13 = uVar15 - local_88.y1.m_i;
          if ((local_88.y2.m_i - local_88.y1.m_i) + 1 <= iVar13) break;
          jpeg_read_scanlines(info,ppJVar17,1);
          if (-1 < iVar13) {
            if (info->output_components == 3) {
              lVar18 = (long)local_88.x1.m_i;
              pJVar4 = *ppJVar17;
              pqVar19 = (quint32 *)QImage::scanLine(AVar27);
              (*converter)(pqVar19,pJVar4 + lVar18 * 3,(local_88.x2.m_i - local_88.x1.m_i) + 1);
            }
            else if (info->out_color_space == JCS_CMYK) {
              iVar13 = local_88.x1.m_i << 2;
              pJVar4 = *ppJVar17;
              pvVar20 = (void *)QImage::scanLine(AVar27);
              if (invertCMYK) {
                for (lVar18 = 0; (int)lVar18 < (local_88.x2.m_i - local_88.x1.m_i) + 1;
                    lVar18 = lVar18 + 1) {
                  *(uint *)((long)pvVar20 + lVar18 * 4) = ~*(uint *)(pJVar4 + iVar13 + lVar18 * 4);
                }
              }
              else {
                memcpy(pvVar20,pJVar4 + iVar13,(long)((local_88.x2.m_i - local_88.x1.m_i) * 4 + 4));
              }
            }
            else if (info->output_components == 1) {
              pvVar20 = (void *)QImage::scanLine(AVar27);
              memcpy(pvVar20,*ppJVar17 + local_88.x1.m_i,
                     (long)((local_88.x2.m_i - local_88.x1.m_i) + 1));
            }
          }
        }
      }
      if (uVar15 == uVar16) {
        jpeg_finish_decompress(info);
      }
      bVar12 = info->density_unit;
      uVar16 = (uint)bVar12;
      if (bVar12 == 2) {
        QImage::setDotsPerMeterX(AVar27);
LAB_001068bf:
        uVar16 = QImage::setDotsPerMeterY(AVar27);
      }
      else if (bVar12 == 1) {
        QImage::setDotsPerMeterX(AVar27);
        goto LAB_001068bf;
      }
      if ((-1 < RVar30.m_i) && (-1 < RVar26.m_i)) {
        if (RVar30.m_i == (local_88.x2.m_i - local_88.x1.m_i) + 1) {
          uVar16 = (local_88.y2.m_i - local_88.y1.m_i) + 1;
          if (RVar26.m_i == uVar16) goto LAB_00106928;
        }
        QImage::scaled((QSize *)&row,AVar27,(TransformationMode)&scaledSize_local);
        QImage::operator=(outImage,(QImage *)&row);
        uVar16 = QImage::~QImage((QImage *)&row);
      }
LAB_00106928:
      auVar32._0_4_ = -(uint)(local_50.x2.m_i < local_50.x1.m_i);
      auVar32._4_4_ = auVar32._0_4_;
      auVar32._8_4_ = -(uint)(local_50.y2.m_i < local_50.y1.m_i);
      auVar32._12_4_ = -(uint)(local_50.y2.m_i < local_50.y1.m_i);
      iVar13 = movmskpd(uVar16,auVar32);
      if (iVar13 == 0) {
        QImage::copy((QRect *)&row);
        QImage::operator=(outImage,(QImage *)&row);
        QImage::~QImage((QImage *)&row);
      }
      bVar12 = QImage::isNull();
      bVar12 = bVar12 ^ 1;
      goto LAB_001061d1;
    }
  }
  else {
    my_output_message((j_common_ptr)info);
    QVar37.x2.m_i = local_88.x2.m_i;
    QVar37.y2.m_i = local_88.y2.m_i;
    QVar37.x1.m_i = local_88.x1.m_i;
    QVar37.y1.m_i = local_88.y1.m_i;
  }
LAB_001061cf:
  bVar12 = 0;
  local_88 = QVar37;
LAB_001061d1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return (bool)bVar12;
}

Assistant:

static bool read_jpeg_image(QImage *outImage,
                            QSize scaledSize, QRect scaledClipRect,
                            QRect clipRect, int quality,
                            Rgb888ToRgb32Converter converter,
                            j_decompress_ptr info, struct my_error_mgr* err, bool invertCMYK)
{
    if (!setjmp(err->setjmp_buffer)) {
        // -1 means default quality.
        if (quality < 0)
            quality = 75;

        // If possible, merge the scaledClipRect into either scaledSize
        // or clipRect to avoid doing a separate scaled clipping pass.
        // Best results are achieved by clipping before scaling, not after.
        if (!scaledClipRect.isEmpty()) {
            if (scaledSize.isEmpty() && clipRect.isEmpty()) {
                // No clipping or scaling before final clip.
                clipRect = scaledClipRect;
                scaledClipRect = QRect();
            } else if (scaledSize.isEmpty()) {
                // Clipping, but no scaling: combine the clip regions.
                scaledClipRect.translate(clipRect.topLeft());
                clipRect = scaledClipRect.intersected(clipRect);
                scaledClipRect = QRect();
            } else if (clipRect.isEmpty()) {
                // No clipping, but scaling: if we can map back to an
                // integer pixel boundary, then clip before scaling.
                if ((info->image_width % scaledSize.width()) == 0 &&
                        (info->image_height % scaledSize.height()) == 0) {
                    int x = scaledClipRect.x() * info->image_width /
                            scaledSize.width();
                    int y = scaledClipRect.y() * info->image_height /
                            scaledSize.height();
                    int width = (scaledClipRect.right() + 1) *
                                info->image_width / scaledSize.width() - x;
                    int height = (scaledClipRect.bottom() + 1) *
                                 info->image_height / scaledSize.height() - y;
                    clipRect = QRect(x, y, width, height);
                    scaledSize = scaledClipRect.size();
                    scaledClipRect = QRect();
                }
            } else {
                // Clipping and scaling: too difficult to figure out,
                // and not a likely use case, so do it the long way.
            }
        }

        // Determine the scale factor to pass to libjpeg for quick downscaling.
        if (!scaledSize.isEmpty() && info->image_width && info->image_height) {
            if (clipRect.isEmpty()) {
                double f = qMin(double(info->image_width) / scaledSize.width(),
                                double(info->image_height) / scaledSize.height());

                // libjpeg supports M/8 scaling with M=[1,16]. All downscaling factors
                // are a speed improvement, but upscaling during decode is slower.
                info->scale_num   = qBound(1, qCeil(8/f), 8);
                info->scale_denom = 8;
            } else {
                info->scale_denom = qMin(clipRect.width() / scaledSize.width(),
                                         clipRect.height() / scaledSize.height());

                // Only scale by powers of two when clipping so we can
                // keep the exact pixel boundaries
                if (info->scale_denom < 2)
                    info->scale_denom = 1;
                else if (info->scale_denom < 4)
                    info->scale_denom = 2;
                else if (info->scale_denom < 8)
                    info->scale_denom = 4;
                else
                    info->scale_denom = 8;
                info->scale_num = 1;

                // Correct the scale factor so that we clip accurately.
                // It is recommended that the clip rectangle be aligned
                // on an 8-pixel boundary for best performance.
                while (info->scale_denom > 1 &&
                       ((clipRect.x() % info->scale_denom) != 0 ||
                        (clipRect.y() % info->scale_denom) != 0 ||
                        (clipRect.width() % info->scale_denom) != 0 ||
                        (clipRect.height() % info->scale_denom) != 0)) {
                    info->scale_denom /= 2;
                }
            }
        }

        // If high quality not required, use fast decompression
        if ( quality < HIGH_QUALITY_THRESHOLD ) {
            info->dct_method = JDCT_IFAST;
            info->do_fancy_upsampling = FALSE;
        }

        (void) jpeg_calc_output_dimensions(info);

        // Determine the clip region to extract.
        QRect imageRect(0, 0, info->output_width, info->output_height);
        QRect clip;
        if (clipRect.isEmpty()) {
            clip = imageRect;
        } else if (info->scale_denom == info->scale_num) {
            clip = clipRect.intersected(imageRect);
        } else {
            // The scale factor was corrected above to ensure that
            // we don't miss pixels when we scale the clip rectangle.
            clip = QRect(clipRect.x() / int(info->scale_denom),
                         clipRect.y() / int(info->scale_denom),
                         clipRect.width() / int(info->scale_denom),
                         clipRect.height() / int(info->scale_denom));
            clip = clip.intersected(imageRect);
        }

        // Allocate memory for the clipped QImage.
        if (!ensureValidImage(outImage, info, clip.size()))
            return false;

        // Avoid memcpy() overhead if grayscale with no clipping.
        bool quickGray = (info->output_components == 1 &&
                          clip == imageRect);
        if (!quickGray) {
            // Ask the jpeg library to allocate a temporary row.
            // The library will automatically delete it for us later.
            // The libjpeg docs say we should do this before calling
            // jpeg_start_decompress().  We can't use "new" here
            // because we are inside the setjmp() block and an error
            // in the jpeg input stream would cause a memory leak.
            JSAMPARRAY rows = (info->mem->alloc_sarray)
                              ((j_common_ptr)info, JPOOL_IMAGE,
                               info->output_width * info->output_components, 1);

            (void) jpeg_start_decompress(info);

            while (info->output_scanline < info->output_height) {
                int y = int(info->output_scanline) - clip.y();
                if (y >= clip.height())
                    break;      // We've read the entire clip region, so abort.

                (void) jpeg_read_scanlines(info, rows, 1);

                if (y < 0)
                    continue;   // Haven't reached the starting line yet.

                if (info->output_components == 3) {
                    uchar *in = rows[0] + clip.x() * 3;
                    QRgb *out = (QRgb*)outImage->scanLine(y);
                    converter(out, in, clip.width());
                } else if (info->out_color_space == JCS_CMYK) {
                    uchar *in = rows[0] + clip.x() * 4;
                    quint32 *out = (quint32*)outImage->scanLine(y);
                    if (invertCMYK) {
                        for (int i = 0; i < clip.width(); ++i) {
                            *out++ = 0xffffffffu - (in[0] | in[1] << 8 | in[2] << 16 | in[3] << 24);
                            in += 4;
                        }
                    } else {
                        memcpy(out, in, clip.width() * 4);
                    }
                } else if (info->output_components == 1) {
                    // Grayscale.
                    memcpy(outImage->scanLine(y),
                           rows[0] + clip.x(), clip.width());
                }
            }
        } else {
            // Load unclipped grayscale data directly into the QImage.
            (void) jpeg_start_decompress(info);
            while (info->output_scanline < info->output_height) {
                uchar *row = outImage->scanLine(info->output_scanline);
                (void) jpeg_read_scanlines(info, &row, 1);
            }
        }

        if (info->output_scanline == info->output_height)
            (void) jpeg_finish_decompress(info);

        if (info->density_unit == 1) {
            outImage->setDotsPerMeterX(int(100. * info->X_density / 2.54));
            outImage->setDotsPerMeterY(int(100. * info->Y_density / 2.54));
        } else if (info->density_unit == 2) {
            outImage->setDotsPerMeterX(int(100. * info->X_density));
            outImage->setDotsPerMeterY(int(100. * info->Y_density));
        }

        if (scaledSize.isValid() && scaledSize != clip.size()) {
            *outImage = outImage->scaled(scaledSize, Qt::IgnoreAspectRatio, quality >= HIGH_QUALITY_THRESHOLD ? Qt::SmoothTransformation : Qt::FastTransformation);
        }

        if (!scaledClipRect.isEmpty())
            *outImage = outImage->copy(scaledClipRect);
        return !outImage->isNull();
    }
    else {
        my_output_message(j_common_ptr(info));
        return false;
    }
}